

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  int *piVar1;
  bool bVar2;
  int r_size;
  long lVar3;
  row_iterator prVar4;
  long lVar5;
  rc_data *__first;
  rc_data *prVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_88;
  int local_84;
  int local_80;
  float local_7c;
  float local_78;
  float local_74;
  rc_data *local_70;
  pair<int,_int> *local_68;
  bit_array *local_60;
  pair<int,_int> *local_58;
  solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_50;
  undefined8 local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  local_7c = theta;
  local_78 = delta;
  local_74 = kappa;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_74,&local_78,&local_7c);
  if (first._M_current == last._M_current) {
    local_48 = 0;
  }
  else {
    local_50 = this + 0x10;
    local_48 = 0;
    local_60 = x;
    local_58 = last._M_current;
    do {
      local_88 = (first._M_current)->first;
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_50);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar3 = *(long *)(this + 0x50);
        prVar4 = local_38;
        do {
          piVar1 = &prVar4->value;
          prVar4 = prVar4 + 1;
          *(float *)(lVar3 + (long)*piVar1 * 4) = local_7c * *(float *)(lVar3 + (long)*piVar1 * 4);
        } while (prVar4 != (row_iterator)local_40._M_head_impl);
      }
      r_size = solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                           *)this,local_38,(row_iterator)local_40._M_head_impl,x);
      lVar3 = (long)r_size;
      if (1 < r_size) {
        __first = *(rc_data **)(this + 0x58);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar6 = __first + lVar3;
        local_80 = r_size;
        local_68 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar6,(int)LZCOUNT(lVar3) * 2 ^ 0x7e);
        local_70 = prVar6;
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar6);
        lVar5 = lVar3 * 8 + -8;
        prVar6 = __first;
        do {
          prVar6 = prVar6 + 1;
          if ((__first->value != prVar6->value) || (NAN(__first->value) || NAN(prVar6->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar6,__g);
            __first = prVar6;
          }
          lVar5 = lVar5 + -8;
        } while (lVar5 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_70,__g);
        first._M_current = local_68;
        r_size = local_80;
      }
      local_84 = solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                 ::select_variables((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                                     *)this,r_size,
                                    *(int *)(*(long *)(this + 0x60) + (long)local_88 * 8),
                                    *(int *)(*(long *)(this + 0x60) + 4 + (long)local_88 * 8));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_88,
                 (int *)((long)local_88 * 8 + *(long *)(this + 0x60)));
      if (0 < r_size) {
        lVar5 = 0;
        do {
          fmt_01._M_str = "({} {}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<float,int>
                    ((debug_logger<true> *)this,fmt_01,(float *)(*(long *)(this + 0x58) + lVar5),
                     (int *)(*(long *)(this + 0x58) + 4 + lVar5));
          lVar5 = lVar5 + 8;
        } while (lVar3 * 8 - lVar5 != 0);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x60) + 4 + (long)local_88 * 8),&local_84);
      x = local_60;
      bVar2 = affect<baryonyx::itm::solver_inequalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                        ((solver_inequalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)this,local_60,local_38,local_88,local_84,r_size,local_74,local_78);
      first._M_current = first._M_current + 1;
      local_48 = CONCAT71((int7)((ulong)local_48 >> 8),(byte)local_48 | bVar2);
    } while (first._M_current != local_58);
  }
  return (bool)((byte)local_48 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < r_size; ++i)
                logger::log("({} {}) ", R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }